

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
proto2_unittest::TestRedactedMessage::InternalSwap
          (TestRedactedMessage *this,TestRedactedMessage *other)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  Any *pAVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  Any *pAVar8;
  ulong uVar9;
  ulong uVar10;
  long __tmp;
  
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar9 = uVar2;
  if ((uVar2 & 1) != 0) {
    uVar9 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  uVar3 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar10 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar10 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  if (uVar9 == uVar10) {
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar3;
    (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar2;
    uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    pvVar5 = (other->field_0)._impl_.text_field_.tagged_ptr_.ptr_;
    pvVar6 = (other->field_0)._impl_.meta_annotated_.tagged_ptr_.ptr_;
    pvVar7 = (this->field_0)._impl_.meta_annotated_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.text_field_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.text_field_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.meta_annotated_.tagged_ptr_.ptr_ = pvVar7;
    (this->field_0)._impl_.text_field_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.meta_annotated_.tagged_ptr_.ptr_ = pvVar6;
    pvVar5 = (other->field_0)._impl_.repeated_meta_annotated_.tagged_ptr_.ptr_;
    pvVar6 = (other->field_0)._impl_.unredacted_repeated_annotations_.tagged_ptr_.ptr_;
    pvVar7 = (this->field_0)._impl_.unredacted_repeated_annotations_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.repeated_meta_annotated_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.repeated_meta_annotated_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.unredacted_repeated_annotations_.tagged_ptr_.ptr_ = pvVar7;
    (this->field_0)._impl_.repeated_meta_annotated_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.unredacted_repeated_annotations_.tagged_ptr_.ptr_ = pvVar6;
    pvVar5 = (other->field_0)._impl_.unreported_non_meta_debug_redact_field_.tagged_ptr_.ptr_;
    pvVar6 = (other->field_0)._impl_.redactable_false_.tagged_ptr_.ptr_;
    pvVar7 = (this->field_0)._impl_.redactable_false_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.unreported_non_meta_debug_redact_field_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.unreported_non_meta_debug_redact_field_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.redactable_false_.tagged_ptr_.ptr_ = pvVar7;
    (this->field_0)._impl_.unreported_non_meta_debug_redact_field_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.redactable_false_.tagged_ptr_.ptr_ = pvVar6;
    pvVar5 = (other->field_0)._impl_.test_direct_message_enum_.tagged_ptr_.ptr_;
    pvVar6 = (other->field_0)._impl_.test_nested_message_enum_.tagged_ptr_.ptr_;
    pvVar7 = (this->field_0)._impl_.test_nested_message_enum_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.test_direct_message_enum_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.test_direct_message_enum_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.test_nested_message_enum_.tagged_ptr_.ptr_ = pvVar7;
    (this->field_0)._impl_.test_direct_message_enum_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.test_nested_message_enum_.tagged_ptr_.ptr_ = pvVar6;
    pAVar4 = (this->field_0)._impl_.any_field_;
    pvVar5 = (other->field_0)._impl_.test_redacted_message_enum_.tagged_ptr_.ptr_;
    pAVar8 = (other->field_0)._impl_.any_field_;
    (other->field_0)._impl_.test_redacted_message_enum_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.test_redacted_message_enum_.tagged_ptr_.ptr_;
    (this->field_0)._impl_.test_redacted_message_enum_.tagged_ptr_.ptr_ = pvVar5;
    (this->field_0)._impl_.any_field_ = pAVar8;
    (other->field_0)._impl_.any_field_ = pAVar4;
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }